

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aGen.hpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ag::BitConverter::GetFloat
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,float u)

{
  size_t i;
  long lVar1;
  allocator_type local_d;
  float u_local;
  
  u_local = u;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,4,&local_d);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start[lVar1] = *(uchar *)((long)&u_local + lVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<uint8_t> GetFloat(float u)
		{
			uint8_t const * p = reinterpret_cast<uint8_t const*>(&u);

			std::vector<uint8_t> ret(sizeof(float));
			for (size_t i = 0; i < sizeof(float); i++)
				ret[i] = p[i];

			return ret;
		}